

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O1

void __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::AddShadowedData
          (DictionaryPropertyDescriptor<unsigned_short> *this,unsigned_short *nextPropertyIndex,
          bool addingLetConstGlobal)

{
  Flags FVar1;
  code *pcVar2;
  bool bVar3;
  unsigned_short uVar4;
  undefined4 *puVar5;
  
  if ((this->flags & IsShadowed) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xef,"(!GetIsShadowed())","!GetIsShadowed()");
    if (!bVar3) goto LAB_00db2521;
    *puVar5 = 0;
  }
  FVar1 = this->flags;
  this->flags = FVar1 | IsShadowed;
  if ((FVar1 & IsAccessor) == None) {
    if (addingLetConstGlobal) {
      this->Getter = this->Data;
LAB_00db246f:
      uVar4 = *nextPropertyIndex;
      if (uVar4 == 0xffff) {
LAB_00db2523:
        ::Math::DefaultOverflowPolicy();
      }
      *nextPropertyIndex = uVar4 + 1;
      this->Data = uVar4;
    }
    else {
      uVar4 = *nextPropertyIndex;
      if (uVar4 == 0xffff) goto LAB_00db2523;
      *nextPropertyIndex = uVar4 + 1;
      this->Getter = uVar4;
    }
    this->Attributes = this->Attributes | 0x10;
    if (!addingLetConstGlobal) goto LAB_00db24ba;
    uVar4 = GetDataPropertyIndex<true>(this);
  }
  else {
    if (this->Data != 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xf3,"(this->Data == NoSlots)","this->Data == NoSlots");
      if (!bVar3) goto LAB_00db2521;
      *puVar5 = 0;
    }
    if (addingLetConstGlobal) goto LAB_00db246f;
    this->Attributes = this->Attributes | 0x10;
LAB_00db24ba:
    uVar4 = GetDataPropertyIndex<false>(this);
  }
  if (uVar4 == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x103,
                                "((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots)"
                                ,
                                "(addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots"
                               );
    if (!bVar3) {
LAB_00db2521:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::AddShadowedData(TPropertyIndex& nextPropertyIndex, bool addingLetConstGlobal)
    {
        Assert(!GetIsShadowed());
        SetIsShadowed(true);
        if (GetIsAccessor())
        {
            Assert(this->Data == NoSlots);
            if (addingLetConstGlobal)
            {
                this->Data = ::Math::PostInc(nextPropertyIndex);
            }
        }
        else if (addingLetConstGlobal)
        {
            this->Getter = this->Data;
            this->Data = ::Math::PostInc(nextPropertyIndex);
        }
        else
        {
            this->Getter = ::Math::PostInc(nextPropertyIndex);
        }
        this->Attributes |= PropertyLetConstGlobal;
        Assert((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots);
    }